

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private.hpp
# Opt level: O1

void __thiscall
baryonyx::info<std::basic_string_view<char,std::char_traits<char>>,bool,std::__cxx11::string>
          (baryonyx *this,context *ctx,char *fmt,
          basic_string_view<char,_std::char_traits<char>_> *arg1,bool *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_00;
  undefined1 local_40 [24];
  ulong local_28;
  undefined8 local_18;
  undefined8 uStack_10;
  
  if (5 < *(int *)(this + 0x178)) {
    local_40._16_8_ = *(undefined8 *)fmt;
    local_40._8_8_ = *(color_type *)(fmt + 8);
    local_28 = (ulong)(byte)arg1->_M_len;
    local_18 = *(undefined8 *)args;
    uStack_10 = *(undefined8 *)(args + 8);
    args_00.field_1.values_ =
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
         args_1;
    args_00.desc_ = (unsigned_long_long)(local_40 + 8);
    local_40._0_8_ = ctx;
    ::fmt::v7::vprint<char_const*,char>
              (_stdout,(FILE *)(context::message_style + 0x78),(text_style *)local_40,(char **)0xd7d
               ,args_00);
  }
  return;
}

Assistant:

inline bool
is_loggable(context::message_type current_level, int level) noexcept
{
    return static_cast<int>(current_level) >= level;
}